

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O0

string * __thiscall
Assimp::(anonymous_namespace)::GetMeshName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,aiMesh *mesh,uint index,
          aiNode *node)

{
  int iVar1;
  char *pcVar2;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string result;
  char postfix [10];
  allocator<char> local_29;
  aiString *local_28;
  aiNode *node_local;
  _anonymous_namespace_ *p_Stack_18;
  uint index_local;
  aiMesh *mesh_local;
  
  node_local._4_4_ = (int32_t)mesh;
  local_28 = (aiString *)CONCAT44(in_register_0000000c,index);
  p_Stack_18 = this;
  mesh_local = (aiMesh *)__return_storage_ptr__;
  if (GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::underscore_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                                 underscore_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                  underscore_abi_cxx11_,"_",&local_29);
      std::allocator<char>::~allocator(&local_29);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                    underscore_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                           underscore_abi_cxx11_);
    }
  }
  result.field_2._8_8_ = 0;
  ASSIMP_itoa10<10ul>((char (*) [10])((long)&result.field_2 + 8),node_local._4_4_);
  pcVar2 = aiString::C_Str(local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,pcVar2,&local_69);
  std::allocator<char>::~allocator(&local_69);
  if (*(int *)(p_Stack_18 + 0xec) != 0) {
    pcVar2 = aiString::C_Str((aiString *)(p_Stack_18 + 0xec));
    std::operator+(&local_90,
                   &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                    underscore_abi_cxx11_,pcVar2);
    std::__cxx11::string::operator+=((string *)local_68,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                  underscore_abi_cxx11_);
  std::operator+(__return_storage_ptr__,&local_b0,result.field_2._M_local_buf + 8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string GetMeshName(const aiMesh& mesh, unsigned int index, const aiNode& node) {
        static const std::string underscore = "_";
        char postfix[10] = {0};
        ASSIMP_itoa10(postfix, index);

        std::string result = node.mName.C_Str();
        if (mesh.mName.length > 0) {
            result += underscore + mesh.mName.C_Str();
        }
        return result + underscore + postfix;
    }